

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O3

int zueci_eci_to_utf8(int eci,uchar *src,int src_len,uint replacement_char,uint flags,uchar *dest,
                     int *p_dest_len)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_0000000c;
  size_t sVar7;
  byte *pbVar8;
  byte *pbVar9;
  int iVar10;
  zueci_u32 len;
  uchar *puVar11;
  zueci_u32 u;
  size_t local_68;
  uchar local_59 [5];
  uint local_54;
  uchar *local_50;
  size_t local_48;
  undefined8 local_40;
  zueci_utf8_func_t local_38;
  
  local_40 = CONCAT44(in_register_0000000c,replacement_char);
  if ((uint)eci < 0x24) {
    if (eci == 0xe) {
      return 7;
    }
    if (eci == 0x13) {
      return 7;
    }
  }
  else if ((eci != 899) && (eci != 0xaa)) {
    return 7;
  }
  if (p_dest_len == (int *)0x0 || (dest == (uchar *)0x0 || src == (uchar *)0x0)) {
    return 8;
  }
  sVar7 = (size_t)src_len;
  pbVar1 = src + sVar7;
  iVar5 = (int)dest;
  if ((eci == 899) ||
     (((flags & 1) != 0 &&
      ((((uint)eci < 0x1c && ((0x800000aU >> (eci & 0x1fU) & 1) != 0)) || (eci == 0xaa)))))) {
    if (0 < src_len) {
      do {
        bVar2 = *src;
        src = src + 1;
        uVar4 = zueci_encode_utf8((uint)bVar2,dest);
        dest = dest + uVar4;
      } while (src < pbVar1);
    }
    src_len = (int)dest - iVar5;
LAB_0018f5c7:
    iVar10 = 0;
    goto LAB_0018f5ca;
  }
  if (replacement_char == 0) {
    local_68 = 0;
  }
  else {
    if (0xd7ff < replacement_char && replacement_char - 0x10000 < 0xffffe000) {
      return 8;
    }
    local_48 = sVar7;
    uVar4 = zueci_encode_utf8(replacement_char,local_59);
    local_68 = (size_t)uVar4;
    sVar7 = local_48;
  }
  if ((eci & 0x3bdU) == 1) {
    iVar10 = 0;
    iVar3 = 0;
    if (0 < src_len) {
      do {
        iVar10 = iVar3;
        if ((char)*src < -0x60) {
          if ((int)local_40 == 0) {
            return 6;
          }
          memcpy(dest,local_59,local_68);
          iVar10 = 1;
          sVar7 = local_68;
        }
        else {
          uVar4 = zueci_encode_utf8((uint)*src,dest);
          sVar7 = (size_t)uVar4;
        }
        dest = dest + sVar7;
        src = src + 1;
        iVar3 = iVar10;
      } while (src < pbVar1);
    }
    src_len = (int)dest - iVar5;
    goto LAB_0018f5ca;
  }
  puVar11 = dest;
  local_50 = dest;
  if (eci == 0xaa) {
    local_38 = zueci_ascii_inv_u;
LAB_0018f787:
    if (src_len < 1) {
LAB_0018f82d:
      iVar10 = 0;
    }
    else {
      iVar10 = 0;
      do {
        local_48 = CONCAT44(local_48._4_4_,iVar10);
        len = (int)pbVar1 - (int)src;
        iVar5 = (*local_38)(src,len,flags,&local_54);
        if (iVar5 == 0) {
          if ((int)local_40 == 0) {
            return 6;
          }
          memcpy(puVar11,local_59,local_68);
          iVar5 = zueci_replacement_incr(eci,src,len);
          iVar10 = 1;
          uVar6 = local_68;
        }
        else {
          uVar4 = zueci_encode_utf8(local_54,puVar11);
          uVar6 = (ulong)uVar4;
          iVar10 = (int)local_48;
        }
        puVar11 = puVar11 + uVar6;
        src = src + iVar5;
      } while (src < pbVar1);
    }
  }
  else {
    if (eci != 0x1a) {
      local_38 = zueci_utf8_funcs[(uint)eci];
      goto LAB_0018f787;
    }
    if ((int)local_40 == 0) {
      uVar4 = 0;
      pbVar9 = src;
      while (pbVar9 < pbVar1) {
        bVar2 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        uVar4 = (uint)(byte)zueci_decode_utf8_utf8d
                            [(ulong)uVar4 + (ulong)(byte)zueci_decode_utf8_utf8d[bVar2] + 0x100];
        if (uVar4 == 0xc) {
          return 9;
        }
      }
      if (uVar4 != 0) {
        return 9;
      }
      memcpy(dest,src,sVar7);
      goto LAB_0018f5c7;
    }
    if (src_len < 1) goto LAB_0018f82d;
    iVar10 = 0;
    do {
      uVar4 = 0;
      do {
        pbVar9 = src;
        bVar2 = *pbVar9;
        if (uVar4 == 0) {
          local_54 = 0xffU >> (zueci_decode_utf8_utf8d[bVar2] & 0x1f) & (uint)bVar2;
        }
        else {
          local_54 = (int)dest << 6 | bVar2 & 0x3f;
        }
        dest = (uchar *)(ulong)local_54;
        src = pbVar9 + 1;
        bVar2 = zueci_decode_utf8_utf8d
                [(ulong)(byte)zueci_decode_utf8_utf8d[bVar2] + (ulong)uVar4 + 0x100];
        uVar4 = (uint)bVar2;
        if (pbVar1 <= src) {
          if (bVar2 != 0) {
            if (-1 < (char)*pbVar9) {
              src = pbVar9;
            }
            goto LAB_0018f71b;
          }
LAB_0018f742:
          uVar4 = zueci_encode_utf8(local_54,puVar11);
          sVar7 = (size_t)uVar4;
          goto LAB_0018f755;
        }
        if (bVar2 == 0) goto LAB_0018f742;
      } while (uVar4 != 0xc);
      pbVar8 = pbVar9;
      if ((char)*pbVar9 < '\0') {
        pbVar8 = src;
      }
      if ((char)*pbVar9 < '\0' && pbVar1 > src) {
LAB_0018f71b:
        pbVar8 = src;
      }
      memcpy(puVar11,local_59,local_68);
      iVar10 = 1;
      sVar7 = local_68;
      src = pbVar8;
LAB_0018f755:
      puVar11 = puVar11 + sVar7;
    } while (src < pbVar1);
  }
  src_len = (int)puVar11 - (int)local_50;
LAB_0018f5ca:
  *p_dest_len = src_len;
  return iVar10;
}

Assistant:

ZUECI_EXTERN int zueci_eci_to_utf8(const int eci, const unsigned char src[], const int src_len,
                    const unsigned int replacement_char, const unsigned int flags, unsigned char dest[],
                    int *p_dest_len) {
    const unsigned char *s = src;
    const unsigned char *const se = src + src_len;
    unsigned char *d = dest;
    zueci_utf8_func_t utf8_func;
    zueci_u32 u;
    int src_incr;
    unsigned char replacement[5];
    int replacement_len = 0; /* g++ complains with "-Wmaybe-uninitialized" if this isn't set */
    int ret = 0;

    if (!zueci_is_valid_eci(eci)) {
        return ZUECI_ERROR_INVALID_ECI;
    }
    if (!src || !dest || !p_dest_len) {
        return ZUECI_ERROR_INVALID_ARGS;
    }

    /* Special case Binary, and if straight-thru flag set then ISO/IEC 8859-1, ASCII and ISO/IEC 646 Invariant also */
    if (eci == 899 || ((flags & ZUECI_FLAG_SB_STRAIGHT_THRU) && (eci == 1 || eci == 3 || eci == 27 || eci == 170))) {
        while (s < se) {
            d += zueci_encode_utf8(*s++, d);
        }
        *p_dest_len = (int) (d - dest);
        return 0;
    }

    if (replacement_char) {
        if (!ZUECI_IS_VALID_UNICODE(replacement_char) || replacement_char > 0xFFFF) { /* Allow BMP only */
            return ZUECI_ERROR_INVALID_ARGS;
        }
        replacement_len = zueci_encode_utf8(replacement_char, replacement);
    }

    /* Special case ISO/IEC 8859-1 */
    if (eci == 1 || eci == 3) {
        for (; s < se; s++) {
            if (*s >= 0x80 && *s < 0xA0) {
                if (!replacement_char) {
                    return ZUECI_ERROR_INVALID_DATA;
                }
                memcpy(d, replacement, replacement_len);
                d += replacement_len;
                ret = ZUECI_WARN_INVALID_DATA;
            } else {
                d += zueci_encode_utf8(*s, d);
            }
        }
        *p_dest_len = (int) (d - dest);
        return ret;
    }

    /* Special case UTF-8 */
    if (eci == 26) {
        if (replacement_char) {
            unsigned int state = 0;
            while (s < se) {
                do {
                    zueci_decode_utf8(&state, &u, *s++);
                } while (s < se && state != 0 && state != 12);
                if (state != 0) {
                    if (*(s - 1) < 0x80) { /* If previous ASCII, backtrack */
                        s--;
                    } else {
                        while (s < se && (*s & 0xC0) == 0x80) { /* Skip any continuation bytes */
                            s++;
                        }
                    }
                    memcpy(d, replacement, replacement_len);
                    d += replacement_len;
                    ret = ZUECI_WARN_INVALID_DATA;
                    state = 0;
                } else {
                    d += zueci_encode_utf8(u, d);
                }
            }
            *p_dest_len = (int) (d - dest);
            return ret;
        }
        if (!zueci_is_valid_utf8(src, src_len)) {
            return ZUECI_ERROR_INVALID_UTF8;
        }
        memcpy(dest, src, src_len);
        *p_dest_len = src_len;
        return 0;
    }

    if (eci == 170) {
        utf8_func = zueci_ascii_inv_u;
    } else {
        utf8_func = zueci_utf8_funcs[eci];
    }

    while (s < se) {
        if (!(src_incr = (*utf8_func)(s, (int) (se - s), flags, &u))) {
            if (!replacement_char) {
                return ZUECI_ERROR_INVALID_DATA;
            }
            memcpy(d, replacement, replacement_len);
            s += zueci_replacement_incr(eci, s, (int) (se - s));
            d += replacement_len;
            ret = ZUECI_WARN_INVALID_DATA;
        } else {
            s += src_incr;
            d += zueci_encode_utf8(u, d);
        }
    }
    *p_dest_len = (int) (d - dest);
    return ret;
}